

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.h
# Opt level: O1

void PrintConstant(InstructionVMGraphContext *ctx,VmConstant *constant)

{
  VmValueType VVar1;
  SynIdentifier *pSVar2;
  TypeBase *pTVar3;
  FunctionData *pFVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  char *format;
  ulong uVar8;
  double dVar9;
  
  VVar1 = (constant->super_VmValue).type.type;
  uVar5 = (constant->super_VmValue).type.size;
  if ((VVar1 == VM_TYPE_VOID) && (uVar5 == 0)) {
    pcVar7 = "{}";
    goto LAB_001cbb11;
  }
  if (uVar5 == 4 && VVar1 == VM_TYPE_INT) {
    if (constant->isFloat == true) {
      dVar9 = (double)(float)constant->iValue;
      pcVar7 = "%ff";
      goto LAB_001cbb81;
    }
    if (uVar5 == 4 && VVar1 == VM_TYPE_INT) {
      uVar6 = (ulong)(uint)constant->iValue;
      pcVar7 = "%d";
      goto LAB_001cbc24;
    }
  }
  if ((VVar1 == VM_TYPE_DOUBLE) && (uVar5 == 8)) {
    dVar9 = constant->dValue;
    pcVar7 = "%f";
LAB_001cbb81:
    Print(ctx,pcVar7,dVar9);
    return;
  }
  if ((VVar1 == VM_TYPE_LONG) && (uVar5 == 8)) {
    Print(ctx,"%lldl",constant->lValue);
    return;
  }
  if (VVar1 == VM_TYPE_POINTER) {
    if ((constant->container != (VariableData *)0x0) && (ctx->showContainers == true)) {
      pSVar2 = constant->container->name;
      pcVar7 = (pSVar2->name).begin;
      uVar6 = (ulong)(uint)(*(int *)&(pSVar2->name).end - (int)pcVar7);
      uVar8 = (ulong)(uint)constant->iValue;
      format = "%.*s+0x%x";
      goto LAB_001cbce1;
    }
    if (constant->container == (VariableData *)0x0) goto LAB_001cbc00;
    uVar5 = constant->iValue + constant->container->offset;
  }
  else {
LAB_001cbc00:
    if (VVar1 == VM_TYPE_FUNCTION) {
      pFVar4 = constant->fValue->function;
      if (pFVar4 == (FunctionData *)0x0) {
        pcVar7 = "global.f0000";
LAB_001cbb11:
        Print(ctx,pcVar7);
        return;
      }
      pcVar7 = (pFVar4->name->name).begin;
      uVar6 = (ulong)(uint)(*(int *)&(pFVar4->name->name).end - (int)pcVar7);
      uVar8 = (ulong)pFVar4->uniqueId;
      format = "%.*s.f%04x";
LAB_001cbce1:
      Print(ctx,format,uVar6,pcVar7,uVar8);
      return;
    }
    if (VVar1 == VM_TYPE_STRUCT) {
      if ((constant->isReference == true) && (ctx->showContainers == true)) {
        pSVar2 = constant->container->name;
        pcVar7 = (pSVar2->name).begin;
        uVar6 = (ulong)(uint)(*(int *)&(pSVar2->name).end - (int)pcVar7);
        uVar8 = (ulong)(uint)constant->iValue;
        format = "*(%.*s+0x%x)";
        goto LAB_001cbce1;
      }
      if (constant->isReference != true) {
        pTVar3 = (constant->super_VmValue).type.structType;
        Print(ctx,"{ %.*s }",(ulong)(uint)(*(int *)&(pTVar3->name).end - (int)(pTVar3->name).begin))
        ;
        return;
      }
      uVar6 = (ulong)(constant->iValue + constant->container->offset);
      pcVar7 = "*(0x%x)";
      goto LAB_001cbc24;
    }
    if (VVar1 != VM_TYPE_POINTER) {
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmGraph.cpp"
                    ,0xd8,"void PrintConstant(InstructionVMGraphContext &, VmConstant *)");
    }
    uVar5 = constant->iValue;
  }
  uVar6 = (ulong)uVar5;
  pcVar7 = "0x%x";
LAB_001cbc24:
  Print(ctx,pcVar7,uVar6);
  return;
}

Assistant:

bool operator==(const VmType& rhs) const
	{
		return type == rhs.type && size == rhs.size;
	}